

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

Sign anon_unknown.dwarf_5db41::side4h_3d_exact_SOS
               (double *p0,double *p1,double *p2,double *p3,double *p4,double h0,double h1,double h2
               ,double h3,double h4,bool sos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  index_t iVar5;
  int iVar6;
  double *pdVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  expansion *peVar11;
  int iVar12;
  index_t iVar13;
  uchar *sig;
  uchar *sig_00;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *sig_01;
  expansion *this;
  expansion *peVar14;
  long lVar15;
  expansion *peVar16;
  undefined3 in_register_00000089;
  ulong uVar17;
  expansion *a22;
  long lVar18;
  expansion *peVar19;
  expansion *peVar20;
  expansion *this_00;
  expansion *this_01;
  long lVar21;
  ulong uVar22;
  double dStackY_920;
  expansion local_8f8 [64];
  expansion local_2e8;
  expansion local_2c8;
  expansion local_2a8;
  string local_288;
  expansion local_268;
  expansion local_248;
  expansion local_228;
  expansion local_208;
  expansion local_1e8;
  expansion local_1c8;
  expansion local_1a8;
  expansion local_188;
  expansion local_168;
  expansion local_148;
  expansion local_128;
  expansion local_108;
  expansion local_e8;
  undefined1 local_c8 [8];
  double *p_sort [5];
  allocator local_36;
  allocator local_35;
  int local_34;
  
  local_2e8.length_ = 2;
  dVar1 = *p1;
  dVar2 = *p0;
  local_1c8.x_[1] = dVar1 - dVar2;
  local_1c8.x_[0] =
       (dVar1 - (local_1c8.x_[1] + (dVar1 - local_1c8.x_[1]))) + ((dVar1 - local_1c8.x_[1]) - dVar2)
  ;
  dVar1 = p1[1];
  dVar3 = p0[1];
  local_1a8.x_[1] = dVar1 - dVar3;
  local_1a8.x_[0] =
       (dVar1 - (local_1a8.x_[1] + (dVar1 - local_1a8.x_[1]))) + ((dVar1 - local_1a8.x_[1]) - dVar3)
  ;
  dVar1 = p1[2];
  dVar4 = p0[2];
  local_188.x_[1] = dVar1 - dVar4;
  local_188.x_[0] =
       (dVar1 - (local_188.x_[1] + (dVar1 - local_188.x_[1]))) + ((dVar1 - local_188.x_[1]) - dVar4)
  ;
  local_168.length_ = 2;
  local_168.capacity_ = 2;
  local_168.x_[1] = h0 - h1;
  local_168.x_[0] =
       (h0 - (local_168.x_[1] + (h0 - local_168.x_[1]))) + ((h0 - local_168.x_[1]) - h1);
  dVar1 = *p2;
  local_2e8.x_[1] = dVar1 - dVar2;
  local_2e8.x_[0] =
       (dVar1 - (local_2e8.x_[1] + (dVar1 - local_2e8.x_[1]))) + ((dVar1 - local_2e8.x_[1]) - dVar2)
  ;
  dVar1 = p2[1];
  local_268.x_[1] = dVar1 - dVar3;
  local_268.x_[0] =
       (dVar1 - (local_268.x_[1] + (dVar1 - local_268.x_[1]))) + ((dVar1 - local_268.x_[1]) - dVar3)
  ;
  dVar1 = p2[2];
  local_148.x_[1] = dVar1 - dVar4;
  local_148.x_[0] =
       (dVar1 - (local_148.x_[1] + (dVar1 - local_148.x_[1]))) + ((dVar1 - local_148.x_[1]) - dVar4)
  ;
  local_128.length_ = 2;
  local_128.capacity_ = 2;
  local_128.x_[1] = h0 - h2;
  local_128.x_[0] =
       (h0 - (local_128.x_[1] + (h0 - local_128.x_[1]))) + ((h0 - local_128.x_[1]) - h2);
  dVar1 = *p3;
  local_2c8.x_[1] = dVar1 - dVar2;
  local_2c8.x_[0] =
       (dVar1 - (local_2c8.x_[1] + (dVar1 - local_2c8.x_[1]))) + ((dVar1 - local_2c8.x_[1]) - dVar2)
  ;
  dVar1 = p3[1];
  local_248.x_[1] = dVar1 - dVar3;
  local_248.x_[0] =
       (dVar1 - (local_248.x_[1] + (dVar1 - local_248.x_[1]))) + ((dVar1 - local_248.x_[1]) - dVar3)
  ;
  dVar1 = p3[2];
  local_228.x_[1] = dVar1 - dVar4;
  local_228.x_[0] =
       (dVar1 - (local_228.x_[1] + (dVar1 - local_228.x_[1]))) + ((dVar1 - local_228.x_[1]) - dVar4)
  ;
  local_108.length_ = 2;
  local_108.capacity_ = 2;
  local_108.x_[1] = h0 - h3;
  local_108.x_[0] =
       (h0 - (local_108.x_[1] + (h0 - local_108.x_[1]))) + ((h0 - local_108.x_[1]) - h3);
  dVar1 = *p4;
  local_208.x_[1] = dVar1 - dVar2;
  local_208.x_[0] =
       (dVar1 - (local_208.x_[1] + (dVar1 - local_208.x_[1]))) + ((dVar1 - local_208.x_[1]) - dVar2)
  ;
  dVar1 = p4[1];
  local_1e8.x_[1] = dVar1 - dVar3;
  local_1e8.x_[0] =
       (dVar1 - (local_1e8.x_[1] + (dVar1 - local_1e8.x_[1]))) + ((dVar1 - local_1e8.x_[1]) - dVar3)
  ;
  dVar1 = p4[2];
  local_e8.length_ = 2;
  local_e8.capacity_ = 2;
  local_8f8[0].length_ = 0;
  local_8f8[0].capacity_ = 0xc0;
  local_2a8.x_[1] = dVar1 - dVar4;
  local_2a8.x_[0] =
       (dVar1 - (local_2a8.x_[1] + (dVar1 - local_2a8.x_[1]))) + ((dVar1 - local_2a8.x_[1]) - dVar4)
  ;
  local_e8.x_[1] = h0 - h4;
  local_e8.x_[0] = (h0 - (local_e8.x_[1] + (h0 - local_e8.x_[1]))) + ((h0 - local_e8.x_[1]) - h4);
  dStackY_920 = 6.88742826337719e-318;
  local_2e8.capacity_ = local_2e8.length_;
  local_2c8.length_ = local_2e8.length_;
  local_2c8.capacity_ = local_2e8.length_;
  local_2a8.length_ = local_2e8.length_;
  local_2a8.capacity_ = local_2e8.length_;
  local_268.length_ = local_2e8.length_;
  local_268.capacity_ = local_2e8.length_;
  local_248.length_ = local_2e8.length_;
  local_248.capacity_ = local_2e8.length_;
  local_228.length_ = local_2e8.length_;
  local_228.capacity_ = local_2e8.length_;
  local_208.length_ = local_2e8.length_;
  local_208.capacity_ = local_2e8.length_;
  local_1e8.length_ = local_2e8.length_;
  local_1e8.capacity_ = local_2e8.length_;
  local_1c8.length_ = local_2e8.length_;
  local_1c8.capacity_ = local_2e8.length_;
  local_1a8.length_ = local_2e8.length_;
  local_1a8.capacity_ = local_2e8.length_;
  local_188.length_ = local_2e8.length_;
  local_188.capacity_ = local_2e8.length_;
  local_148.length_ = local_2e8.length_;
  local_148.capacity_ = local_2e8.length_;
  GEO::expansion::assign_det3x3
            (local_8f8,&local_2e8,&local_268,&local_148,&local_2c8,&local_248,&local_228,&local_208,
             &local_1e8,&local_2a8);
  uVar9 = ((local_208.length_ * local_248.length_ + local_2c8.length_ * local_1e8.length_) *
           local_188.length_ +
          (local_228.length_ * local_208.length_ + local_2a8.length_ * local_2c8.length_) *
          local_1a8.length_ +
          (local_228.length_ * local_1e8.length_ + local_2a8.length_ * local_248.length_) *
          local_1c8.length_) * 4;
  uVar17 = (ulong)uVar9 * 8 + 0x10 & 0x7fffffff0;
  lVar15 = -uVar17;
  this_01 = (expansion *)((long)local_8f8 + lVar15);
  *(undefined4 *)((long)local_8f8 - uVar17) = 0;
  *(uint *)((long)local_8f8 + lVar15 + 4) = uVar9;
  *(expansion **)(&stack0xfffffffffffff700 + lVar15) = &local_2a8;
  *(expansion **)(&stack0xfffffffffffff6f8 + lVar15) = &local_1e8;
  *(expansion **)(&stack0xfffffffffffff6f0 + lVar15) = &local_208;
  *(expansion **)(&stack0xfffffffffffff6e8 + lVar15) = &local_228;
  *(undefined8 *)((long)&dStackY_920 + lVar15) = 0x15462a;
  GEO::expansion::assign_det3x3
            (this_01,&local_1c8,&local_1a8,&local_188,&local_2c8,&local_248,
             *(expansion **)(&stack0xfffffffffffff6e8 + lVar15),
             *(expansion **)(&stack0xfffffffffffff6f0 + lVar15),
             *(expansion **)(&stack0xfffffffffffff6f8 + lVar15),
             *(expansion **)(&stack0xfffffffffffff700 + lVar15));
  peVar11 = &local_2e8;
  uVar9 = ((local_208.length_ * local_268.length_ + local_2e8.length_ * local_1e8.length_) *
           local_188.length_ +
          (local_148.length_ * local_208.length_ + local_2a8.length_ * local_2e8.length_) *
          local_1a8.length_ +
          (local_148.length_ * local_1e8.length_ + local_2a8.length_ * local_268.length_) *
          local_1c8.length_) * 4;
  uVar17 = (ulong)uVar9 * 8 + 0x10 & 0x7fffffff0;
  this = (expansion *)((long)this_01 - uVar17);
  *(undefined4 *)((long)this_01 - uVar17) = 0;
  this->capacity_ = uVar9;
  this[-1].x_[1] = (double)&local_2a8;
  this[-1].x_[0] = (double)&local_1e8;
  *(expansion **)(this + -1) = &local_208;
  this[-2].x_[1] = (double)&local_148;
  this[-2].x_[0] = 6.88931065348784e-318;
  GEO::expansion::assign_det3x3
            (this,&local_1c8,&local_1a8,&local_188,peVar11,&local_268,(expansion *)this[-2].x_[1],
             *(expansion **)(this + -1),(expansion *)this[-1].x_[0],(expansion *)this[-1].x_[1]);
  peVar20 = &local_1c8;
  peVar14 = &local_188;
  uVar9 = ((local_2c8.length_ * local_268.length_ + local_2e8.length_ * local_248.length_) *
           local_188.length_ +
          (local_148.length_ * local_2c8.length_ + local_228.length_ * local_2e8.length_) *
          local_1a8.length_ +
          (local_148.length_ * local_248.length_ + local_228.length_ * local_268.length_) *
          local_1c8.length_) * 4;
  uVar17 = (ulong)uVar9 * 8 + 0x10 & 0x7fffffff0;
  this_00 = (expansion *)((long)this - uVar17);
  *(undefined4 *)((long)this - uVar17) = 0;
  this_00->capacity_ = uVar9;
  a22 = &local_268;
  this_00[-1].x_[1] = (double)&local_228;
  this_00[-1].x_[0] = (double)&local_248;
  *(expansion **)(this_00 + -1) = &local_2c8;
  this_00[-2].x_[1] = (double)&local_148;
  this_00[-2].x_[0] = 6.89033336937473e-318;
  GEO::expansion::assign_det3x3
            (this_00,peVar20,&local_1a8,peVar14,peVar11,a22,(expansion *)this_00[-2].x_[1],
             *(expansion **)(this_00 + -1),(expansion *)this_00[-1].x_[0],
             (expansion *)this_00[-1].x_[1]);
  this_00[-1].x_[1] = 6.89039265725224e-318;
  local_34 = GEO::expansion::sign
                       (this_00,(EVP_PKEY_CTX *)peVar20,sig,(size_t *)peVar14,(uchar *)peVar11,
                        (size_t)a22);
  if (local_34 == 0) {
    this_00[-1].x_[1] = 6.89488371397293e-318;
    std::__cxx11::string::string((string *)local_c8,"Delta4_sign != ZERO",&local_36);
    this_00[-1].x_[1] = 6.89499734907148e-318;
    std::__cxx11::string::string
              ((string *)&local_288,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,&local_35);
    this_00[-1].x_[1] = (double)&LAB_00154b83;
    GEO::geo_assertion_failed((string *)local_c8,&local_288,0x5007);
  }
  uVar9 = local_8f8[0].length_ * local_168.length_ * 2;
  lVar18 = (ulong)uVar9 * 8 + 0x10;
  peVar16 = (expansion *)((long)this_00 - lVar18);
  peVar16->length_ = 0;
  peVar16->capacity_ = uVar9;
  peVar16[-1].x_[1] = 6.89076320648662e-318;
  GEO::expansion::assign_product(peVar16,local_8f8,&local_168);
  uVar9 = this_01->length_ * local_128.length_ * 2;
  lVar15 = (ulong)uVar9 * 8 + 0x10;
  peVar19 = (expansion *)((long)peVar16 - lVar15);
  *(undefined4 *)((long)peVar16 - lVar15) = 0;
  peVar19->capacity_ = uVar9;
  peVar19[-1].x_[1] = 6.89108434915641e-318;
  GEO::expansion::assign_product(peVar19,this_01,&local_128);
  peVar19[-1].x_[1] = 6.89112387440808e-318;
  p_sort[4] = (double *)GEO::expansion::negate(peVar19);
  uVar9 = this->length_ * local_108.length_ * 2;
  lVar21 = (ulong)uVar9 * 8 + 0x10;
  peVar20 = (expansion *)((long)peVar19 - lVar21);
  peVar20->length_ = 0;
  peVar20->capacity_ = uVar9;
  peVar20[-1].x_[1] = 6.89149936429892e-318;
  GEO::expansion::assign_product(peVar20,this,&local_108);
  uVar9 = this_00->length_ * local_e8.length_ * 2;
  lVar15 = (ulong)uVar9 * 8 + 0x10;
  peVar14 = (expansion *)((long)peVar20 - lVar15);
  *(undefined4 *)((long)peVar20 - lVar15) = 0;
  peVar14->capacity_ = uVar9;
  peVar14[-1].x_[1] = 6.89181556631226e-318;
  GEO::expansion::assign_product(peVar14,this_00,&local_e8);
  peVar14[-1].x_[1] = 6.89185509156393e-318;
  peVar11 = GEO::expansion::negate(peVar14);
  pdVar7 = p_sort[4];
  iVar12 = *(int *)p_sort[4] + *(int *)((long)this_00 - lVar18) + *(int *)((long)peVar19 - lVar21);
  iVar13 = peVar11->length_;
  uVar17 = (ulong)(iVar12 + iVar13 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar19 = (expansion *)((long)peVar14 - uVar17);
  *(undefined4 *)((long)peVar14 - uVar17) = 0;
  peVar19->capacity_ = iVar12 + iVar13;
  peVar19[-1].x_[1] = 6.89231457261456e-318;
  GEO::expansion::assign_sum(peVar19,peVar16,(expansion *)pdVar7,peVar20,peVar11);
  peVar19[-1].x_[1] = 6.89235409786622e-318;
  iVar10 = GEO::expansion::sign
                     (peVar19,(EVP_PKEY_CTX *)peVar16,sig_00,(size_t *)peVar20,(uchar *)peVar11,
                      (size_t)a22);
  peVar20 = (expansion *)(ulong)CONCAT31(in_register_00000089,!sos || iVar10 != 0);
  iVar12 = iVar10;
  if (sos && iVar10 == 0) {
    peVar14 = (expansion *)(p_sort + 4);
    local_c8 = (undefined1  [8])p0;
    p_sort[0] = p1;
    p_sort[1] = p2;
    p_sort[2] = p3;
    p_sort[3] = p4;
    peVar19[-1].x_[1] = 1.48219693752374e-323;
    uVar8 = peVar19[-1].x_[1];
    peVar19[-1].x_[1] = 6.89278393497811e-318;
    SOS_sort((double **)local_c8,(double **)peVar14,(index_t)uVar8);
    sig_01 = extraout_RDX;
    for (lVar15 = 0; iVar12 = iVar10, lVar15 != 5; lVar15 = lVar15 + 1) {
      pdVar7 = p_sort[lVar15 + -1];
      if (pdVar7 == p0) {
        iVar13 = local_8f8[0].length_ + this_01->length_;
        uVar17 = (ulong)(local_8f8[0].length_ + this_01->length_ + 1) * 8 + 0x17 &
                 0xfffffffffffffff0;
        peVar14 = (expansion *)((long)peVar19 - uVar17);
        peVar14->length_ = 0;
        peVar14->capacity_ = iVar13;
        peVar14[-1].x_[1] = 6.89359420263729e-318;
        GEO::expansion::assign_diff(peVar14,this_01,local_8f8);
        iVar13 = this_00->length_;
        iVar5 = this->length_;
        uVar22 = (ulong)(iVar13 + iVar5 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar20 = (expansion *)((long)peVar14 - uVar22);
        peVar20->length_ = 0;
        peVar20->capacity_ = iVar5 + iVar13;
        peVar20[-1].x_[1] = 6.89391534530708e-318;
        GEO::expansion::assign_diff(peVar20,this_00,this);
        iVar12 = *(int *)((long)peVar19 - uVar17);
        iVar6 = *(int *)((long)peVar14 - uVar22);
        uVar17 = (ulong)(iVar12 + iVar6 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar19 = (expansion *)((long)peVar20 - uVar17);
        *(undefined4 *)((long)peVar20 - uVar17) = 0;
        peVar19->capacity_ = iVar6 + iVar12;
        peVar19[-1].x_[1] = 6.89432047913667e-318;
        GEO::expansion::assign_sum(peVar19,peVar14,peVar20);
        sig_01 = extraout_RDX_00;
        peVar16 = peVar19;
LAB_00154b05:
        peVar19[-1].x_[1] = 6.89451810539501e-318;
        iVar12 = GEO::expansion::sign
                           (peVar16,(EVP_PKEY_CTX *)peVar14,sig_01,(size_t *)peVar20,
                            (uchar *)peVar11,(size_t)a22);
        sig_01 = extraout_RDX_02;
        if (iVar12 != 0) break;
      }
      else {
        if (pdVar7 == p1) {
          peVar16 = local_8f8;
          goto LAB_00154b05;
        }
        if (pdVar7 == p2) {
          peVar19[-1].x_[1] = 6.89444893620459e-318;
          iVar12 = GEO::expansion::sign
                             (this_01,(EVP_PKEY_CTX *)peVar14,sig_01,(size_t *)peVar20,
                              (uchar *)peVar11,(size_t)a22);
          sig_01 = extraout_RDX_01;
          if (iVar12 != 0) {
            return -(local_34 * iVar12);
          }
        }
        else {
          peVar16 = this;
          if (pdVar7 == p3) goto LAB_00154b05;
          if (pdVar7 == p4) {
            peVar19[-1].x_[1] = -NAN;
            return SUB84(peVar19[-1].x_[1],0);
          }
        }
      }
    }
  }
  return iVar12 * local_34;
}

Assistant:

Sign side4h_3d_exact_SOS(
        const double* p0, const double* p1,
        const double* p2, const double* p3, const double* p4,
        double h0, double h1, double h2, double h3, double h4,
        bool sos = true
    ) {
        PCK_STAT(cnt_orient3dh_exact++);

        const expansion& a11 = expansion_diff(p1[0], p0[0]);
        const expansion& a12 = expansion_diff(p1[1], p0[1]);
        const expansion& a13 = expansion_diff(p1[2], p0[2]);
        const expansion& a14 = expansion_diff(h0,h1);

        const expansion& a21 = expansion_diff(p2[0], p0[0]);
        const expansion& a22 = expansion_diff(p2[1], p0[1]);
        const expansion& a23 = expansion_diff(p2[2], p0[2]);
        const expansion& a24 = expansion_diff(h0,h2);

        const expansion& a31 = expansion_diff(p3[0], p0[0]);
        const expansion& a32 = expansion_diff(p3[1], p0[1]);
        const expansion& a33 = expansion_diff(p3[2], p0[2]);
        const expansion& a34 = expansion_diff(h0,h3);

        const expansion& a41 = expansion_diff(p4[0], p0[0]);
        const expansion& a42 = expansion_diff(p4[1], p0[1]);
        const expansion& a43 = expansion_diff(p4[2], p0[2]);
        const expansion& a44 = expansion_diff(h0,h4);

        // Note: we could probably reuse some of the 2x2 co-factors
        // (but for now I'd rather keep this form that is easier to
        //  read ... and to debug if need be !)
        const expansion& Delta1 = expansion_det3x3(
            a21, a22, a23,
            a31, a32, a33,
            a41, a42, a43
        );
        const expansion& Delta2 = expansion_det3x3(
            a11, a12, a13,
            a31, a32, a33,
            a41, a42, a43
        );
        const expansion& Delta3 = expansion_det3x3(
            a11, a12, a13,
            a21, a22, a23,
            a41, a42, a43
        );
        const expansion& Delta4 = expansion_det3x3(
            a11, a12, a13,
            a21, a22, a23,
            a31, a32, a33
        );

        Sign Delta4_sign = Delta4.sign();
        geo_assert(Delta4_sign != ZERO);

        const expansion& r_1 = expansion_product(Delta1, a14);
        const expansion& r_2 = expansion_product(Delta2, a24).negate();
        const expansion& r_3 = expansion_product(Delta3, a34);
        const expansion& r_4 = expansion_product(Delta4, a44).negate();
        const expansion& r = expansion_sum4(r_1, r_2, r_3, r_4);

        Sign r_sign = r.sign();

        // Statistics
        PCK_STAT(len_orient3dh_num = std::max(len_orient3dh_num, r.length()));
        PCK_STAT(len_orient3dh_denom = std::max(len_orient3dh_denom, Delta1.length()));

        // Simulation of Simplicity (symbolic perturbation)
        if(sos && r_sign == ZERO) {
            PCK_STAT(cnt_orient3dh_SOS++);
            const double* p_sort[5];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            p_sort[4] = p4;

	    SOS_sort(p_sort, p_sort + 5, 3);
            for(index_t i = 0; i < 5; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1 = expansion_diff(Delta2, Delta1);
                    const expansion& z2 = expansion_diff(Delta4, Delta3);
                    const expansion& z = expansion_sum(z1, z2);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta4_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    Sign Delta1_sign = Delta1.sign();
                    if(Delta1_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta1.length()));
                        return Sign(Delta4_sign * Delta1_sign);
                    }
                } else if(p_sort[i] == p2) {
                    Sign Delta2_sign = Delta2.sign();
                    if(Delta2_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta2.length()));
                        return Sign(-Delta4_sign * Delta2_sign);
                    }
                } else if(p_sort[i] == p3) {
                    Sign Delta3_sign = Delta3.sign();
                    if(Delta3_sign != ZERO) {
                        PCK_STAT(len_orient3dh_SOS = std::max(len_orient3dh_SOS, Delta3.length()));
                        return Sign(Delta4_sign * Delta3_sign);
                    }
                } else if(p_sort[i] == p4) {
                    return NEGATIVE;
                }
            }
        }
        return Sign(Delta4_sign * r_sign);
    }